

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O0

void testIDManifest(string *tempDir)

{
  string *in_stack_000002d0;
  string *in_stack_00000420;
  
  anon_unknown.dwarf_114bc3::testReadWriteManifest(in_stack_00000420);
  anon_unknown.dwarf_114bc3::testMerge();
  anon_unknown.dwarf_114bc3::testLargeManifest(in_stack_000002d0);
  anon_unknown.dwarf_114bc3::testDoingBadThings();
  return;
}

Assistant:

void
testIDManifest (const std::string& tempDir)
{
    //
    // simple test that the manifest 'round trips' correctly
    //
    testReadWriteManifest (tempDir);

    //
    // test manifest merge operations
    //
    testMerge ();

    // stress test - will randomly generate 'edge cases'
    testLargeManifest (tempDir);

    // test the API prevents creating invalid manifests
    testDoingBadThings ();
}